

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestMutualRecursionA_SubMessage * __thiscall
proto2_unittest::TestMutualRecursionA_SubGroup::_internal_mutable_sub_message
          (TestMutualRecursionA_SubGroup *this)

{
  Arena *arena;
  TestMutualRecursionA_SubMessage *pTVar1;
  TestMutualRecursionA_SubMessage *p;
  TestMutualRecursionA_SubGroup *this_local;
  
  if ((this->field_0)._impl_.sub_message_ == (TestMutualRecursionA_SubMessage *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestMutualRecursionA_SubMessage *)
             google::protobuf::Arena::
             DefaultConstruct<proto2_unittest::TestMutualRecursionA_SubMessage>(arena);
    (this->field_0)._impl_.sub_message_ = pTVar1;
  }
  return (this->field_0)._impl_.sub_message_;
}

Assistant:

inline ::proto2_unittest::TestMutualRecursionA_SubMessage* PROTOBUF_NONNULL TestMutualRecursionA_SubGroup::_internal_mutable_sub_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.sub_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestMutualRecursionA_SubMessage>(GetArena());
    _impl_.sub_message_ = reinterpret_cast<::proto2_unittest::TestMutualRecursionA_SubMessage*>(p);
  }
  return _impl_.sub_message_;
}